

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int dup_identity_check(char *id,lys_ident *ident,uint32_t size)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((ulong)size * 0x48 + 0x48 == lVar2 + 0x48) {
      return 0;
    }
    lVar1 = lVar2 + -0x1c;
    lVar2 = lVar2 + 0x48;
  } while (*(char **)(ident->padding + lVar1) != id);
  return 1;
}

Assistant:

static int
dup_identity_check(const char *id, struct lys_ident *ident, uint32_t size)
{
    uint32_t i;

    for (i = 0; i < size; i++) {
        if (ly_strequal(id, ident[i].name, 1)) {
            /* name collision */
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}